

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O3

void __thiscall CGL::OSDText::~OSDText(OSDText *this)

{
  operator_delete(this->ft,8);
  operator_delete(this->font,1);
  operator_delete(this->face,8);
  std::vector<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>::_M_erase_at_end
            (&this->lines,
             (this->lines).super__Vector_base<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>._M_impl.
             super__Vector_impl_data._M_start);
  (*__glewDeleteProgram)(this->program);
  std::vector<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>::~vector(&this->lines);
  return;
}

Assistant:

OSDText::~OSDText() {

  delete ft;
  delete font;
  delete face;

  lines.clear();

  glDeleteProgram(program);
}